

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

void __thiscall
soul::ResolutionPass::tryPass<soul::ResolutionPass::GenericFunctionResolver>
          (ResolutionPass *this,RunStats *runStats,bool ignoreErrors)

{
  undefined1 local_58 [8];
  GenericFunctionResolver pass;
  bool ignoreErrors_local;
  RunStats *runStats_local;
  ResolutionPass *this_local;
  
  pass.super_FunctionResolver.super_ErrorIgnoringRewritingASTVisitor._55_1_ = ignoreErrors;
  GenericFunctionResolver::GenericFunctionResolver
            ((GenericFunctionResolver *)local_58,this,ignoreErrors);
  ErrorIgnoringRewritingASTVisitor::performPass((ErrorIgnoringRewritingASTVisitor *)local_58);
  runStats->numFailures =
       (long)&((pass.super_FunctionResolver.super_ErrorIgnoringRewritingASTVisitor.module)->
              super_ASTObject)._vptr_ASTObject + runStats->numFailures;
  runStats->numReplaced =
       (long)pass.super_FunctionResolver.super_ErrorIgnoringRewritingASTVisitor.
             super_RewritingASTVisitor._vptr_RewritingASTVisitor + runStats->numReplaced;
  GenericFunctionResolver::~GenericFunctionResolver((GenericFunctionResolver *)local_58);
  return;
}

Assistant:

void tryPass (RunStats& runStats, bool ignoreErrors)
    {
        PassType pass (*this, ignoreErrors);
        pass.performPass();
        runStats.numFailures += pass.numFails;
        runStats.numReplaced += pass.itemsReplaced;
    }